

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

int __thiscall FSectorTagIterator::Next(FSectorTagIterator *this)

{
  int iVar1;
  FTagItem *pFVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  piVar3 = tagManager.startForSector.Array;
  pFVar2 = tagManager.allTags.Array;
  iVar1 = numsectors;
  if (this->searchtag == 0) {
    uVar4 = (ulong)(uint)this->start;
    while ((((iVar5 = (int)uVar4, iVar5 < iVar1 && (-1 < iVar5)) &&
            (iVar5 < (int)tagManager.startForSector.Count)) && (-1 < piVar3[uVar4]))) {
      uVar4 = uVar4 + 1;
      this->start = (int)uVar4;
    }
    if (iVar1 == iVar5) {
      return -1;
    }
    iVar5 = iVar5 + 1;
  }
  else {
    uVar6 = this->start;
    while (-1 < (int)uVar6) {
      if (pFVar2[uVar6].tag == this->searchtag) goto LAB_00455752;
      uVar6 = pFVar2[uVar6].nexttag;
      this->start = uVar6;
    }
    if (uVar6 == 0xffffffff) {
      return -1;
    }
LAB_00455752:
    uVar4 = (ulong)(uint)tagManager.allTags.Array[(int)uVar6].target;
    iVar5 = tagManager.allTags.Array[(int)uVar6].nexttag;
  }
  this->start = iVar5;
  return (int)uVar4;
}

Assistant:

int FSectorTagIterator::Next()
{
	int ret;
	if (searchtag == INT_MIN)
	{
		ret = start;
		start = -1;
	}
	else if (searchtag != 0)
	{
		while (start >= 0 && tagManager.allTags[start].tag != searchtag) start = tagManager.allTags[start].nexttag;
		if (start == -1) return -1;
		ret = tagManager.allTags[start].target;
		start = tagManager.allTags[start].nexttag;
	}
	else
	{
		// with the tag manager, searching for tag 0 has to be different, because it won't create entries for untagged sectors.
		while (start < numsectors && tagManager.SectorHasTags(start))
		{
			start++;
		}
		if (start == numsectors) return -1;
		ret = start;
		start++;
	}
	return ret;
}